

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

void extents_remove_locked(tsdn_t *tsdn,extents_t *extents,extent_t *extent)

{
  _Bool _Var1;
  uint uVar2;
  size_t sz;
  size_t sVar3;
  extent_t *in_RDX;
  extents_t *in_RSI;
  size_t cur_extents_npages;
  size_t npages;
  pszind_t pind;
  size_t psz;
  size_t size;
  size_t result;
  pszind_t ind;
  pszind_t mod;
  size_t delta_inverse_mask;
  pszind_t lg_delta;
  pszind_t grp;
  pszind_t shift;
  pszind_t x;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  size_t in_stack_ffffffffffffff28;
  byte local_b8;
  int local_b4;
  uint local_4;
  
  malloc_mutex_assert_owner
            ((tsdn_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (malloc_mutex_t *)0x1661b5);
  sz = extent_size_get(in_RDX);
  sVar3 = extent_size_quantize_floor(in_stack_ffffffffffffff28);
  if (sVar3 < 0x7000000000000001) {
    uVar2 = lg_floor(sVar3 * 2 - 1);
    if (uVar2 < 0xe) {
      local_b4 = 0;
    }
    else {
      local_b4 = uVar2 - 0xe;
    }
    if (uVar2 < 0xf) {
      local_b8 = 0xc;
    }
    else {
      local_b8 = (char)uVar2 - 3;
    }
    local_4 = local_b4 * 4 +
              ((uint)((sVar3 - 1 & -1L << (local_b8 & 0x3f)) >> (local_b8 & 0x3f)) & 3);
  }
  else {
    local_4 = 199;
  }
  extent_heap_remove((extent_heap_t *)extent,(extent_t *)size);
  extents_stats_sub(in_RSI,local_4,sz);
  _Var1 = extent_heap_empty(in_RSI->heaps + local_4);
  if (_Var1) {
    bitmap_set(in_RSI->bitmap,&extents_bitmap_info,(ulong)local_4);
  }
  extent_list_remove(&in_RSI->lru,in_RDX);
  (in_RSI->npages).repr = (in_RSI->npages).repr - (sz >> 0xc);
  return;
}

Assistant:

static void
extents_remove_locked(tsdn_t *tsdn, extents_t *extents, extent_t *extent) {
	malloc_mutex_assert_owner(tsdn, &extents->mtx);
	assert(extent_state_get(extent) == extents->state);

	size_t size = extent_size_get(extent);
	size_t psz = extent_size_quantize_floor(size);
	pszind_t pind = sz_psz2ind(psz);
	extent_heap_remove(&extents->heaps[pind], extent);

	if (config_stats) {
		extents_stats_sub(extents, pind, size);
	}

	if (extent_heap_empty(&extents->heaps[pind])) {
		bitmap_set(extents->bitmap, &extents_bitmap_info,
		    (size_t)pind);
	}
	extent_list_remove(&extents->lru, extent);
	size_t npages = size >> LG_PAGE;
	/*
	 * As in extents_insert_locked, we hold extents->mtx and so don't need
	 * atomic operations for updating extents->npages.
	 */
	size_t cur_extents_npages =
	    atomic_load_zu(&extents->npages, ATOMIC_RELAXED);
	assert(cur_extents_npages >= npages);
	atomic_store_zu(&extents->npages,
	    cur_extents_npages - (size >> LG_PAGE), ATOMIC_RELAXED);
}